

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdGetCalculateFeeFundRawTx(void *handle,void *fund_handle,int64_t *fee_amount)

{
  CfdException *pCVar1;
  allocator local_49;
  undefined1 local_48 [32];
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)local_48,"FundRawTxData",&local_49);
  cfd::capi::CheckBuffer(fund_handle,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  if (fee_amount == (int64_t *)0x0) {
    local_48._0_8_ = "cfdcapi_transaction.cpp";
    local_48._8_4_ = 0xd46;
    local_48._16_8_ = "CfdGetCalculateFeeFundRawTx";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_48,"fee_amount is null.");
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_48,"Failed to parameter. fee_amount is null.",&local_49);
    cfd::core::CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)local_48);
    __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)fund_handle + 0x50) != 0) {
    *fee_amount = *(int64_t *)((long)fund_handle + 0x60);
    return 0;
  }
  local_48._0_8_ = "cfdcapi_transaction.cpp";
  local_48._8_4_ = 0xd4f;
  local_48._16_8_ = "CfdGetCalculateFeeFundRawTx";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_48,"target addresses is maximum over.");
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_48,"Failed to parameter. target addresses is maximum over.",&local_49);
  cfd::core::CfdException::CfdException(pCVar1,kCfdOutOfRangeError,(string *)local_48);
  __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetCalculateFeeFundRawTx(
    void* handle, void* fund_handle, int64_t* fee_amount) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    if (fee_amount == nullptr) {
      warn(CFD_LOG_SOURCE, "fee_amount is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fee_amount is null.");
    }

    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);
    if (buffer->append_txout_addresses == nullptr) {
      warn(CFD_LOG_SOURCE, "target addresses is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. target addresses is maximum over.");
    }

    *fee_amount = buffer->calculate_fee;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}